

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqbaselib.cpp
# Opt level: O0

SQInteger number_delegate_tochar(HSQUIRRELVM v)

{
  SQSharedState *ss;
  SQString *x;
  SQVM *in_RDI;
  SQChar c;
  SQObject *o;
  SQObjectPtr *in_stack_ffffffffffffffa8;
  HSQUIRRELVM in_stack_ffffffffffffffb0;
  SQChar *in_stack_ffffffffffffffb8;
  SQObjectPtr local_28;
  undefined1 local_11;
  SQObjectPtr *local_10;
  SQVM *local_8;
  
  local_8 = in_RDI;
  local_10 = stack_get(in_stack_ffffffffffffffb0,(SQInteger)in_stack_ffffffffffffffa8);
  if ((local_10->super_SQObject)._type == OT_FLOAT) {
    ss = (SQSharedState *)(long)(local_10->super_SQObject)._unVal.fFloat;
  }
  else {
    ss = (SQSharedState *)(local_10->super_SQObject)._unVal.pTable;
  }
  local_11 = SUB81(ss,0);
  x = SQString::Create(ss,in_stack_ffffffffffffffb8,(SQInteger)local_8);
  SQObjectPtr::SQObjectPtr(&local_28,x);
  SQVM::Push(local_8,in_stack_ffffffffffffffa8);
  SQObjectPtr::~SQObjectPtr((SQObjectPtr *)local_8);
  return 1;
}

Assistant:

static SQInteger number_delegate_tochar(HSQUIRRELVM v)
{
    SQObject &o=stack_get(v,1);
    SQChar c = (SQChar)tointeger(o);
    v->Push(SQString::Create(_ss(v),(const SQChar *)&c,1));
    return 1;
}